

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression __thiscall
dynet::expr::contract3d_1d_1d(expr *this,Expression *x,Expression *y,Expression *z)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint *local_20;
  undefined8 local_18;
  
  local_2c = (x->i).t;
  arguments = x->pg;
  local_20 = &local_2c;
  local_28 = (y->i).t;
  local_24 = (z->i).t;
  local_18 = 3;
  ComputationGraph::add_function<dynet::InnerProduct3D_1D_1D>
            ((ComputationGraph *)(this + 8),(initializer_list<dynet::VariableIndex> *)arguments);
  *(ComputationGraph **)this = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)this;
  return EVar1;
}

Assistant:

Expression contract3d_1d_1d(const Expression& x, const Expression& y, const Expression& z) { return Expression(x.pg, x.pg->add_function<InnerProduct3D_1D_1D>({x.i, y.i, z.i})); }